

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O0

bool __thiscall
MeCab::DictionaryRewriter::rewrite
          (DictionaryRewriter *this,string *feature,string *ufeature,string *lfeature,
          string *rfeature)

{
  bool bVar1;
  undefined1 uVar2;
  ulong uVar3;
  size_t sVar4;
  char *__dest;
  char *__src;
  RewriteRules *pRVar5;
  RewriteRules *pRVar6;
  ostream *poVar7;
  string *output;
  long in_RDI;
  size_t n;
  scoped_fixed_array<char_*,_8192> col;
  scoped_fixed_array<char,_8192> buf;
  scoped_fixed_array<char_*,_8192> *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  size_t in_stack_fffffffffffffe80;
  RewriteRules *in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9e;
  bool bVar8;
  undefined1 in_stack_fffffffffffffe9f;
  char *in_stack_fffffffffffffea0;
  die local_71;
  RewriteRules *local_70;
  byte local_66;
  die local_65 [13];
  scoped_fixed_array<char_*,_8192> local_58;
  scoped_fixed_array<char,_8192> local_40 [2];
  
  scoped_fixed_array<char,_8192>::scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffffe60);
  scoped_fixed_array<char_*,_8192>::scoped_fixed_array(in_stack_fffffffffffffe60);
  uVar3 = std::__cxx11::string::size();
  local_66 = 0;
  sVar4 = scoped_fixed_array<char,_8192>::size(local_40);
  if (sVar4 - 1 <= uVar3) {
    die::die(local_65);
    local_66 = 1;
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xa8);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"feature.size() < buf.size() - 1");
    poVar7 = std::operator<<(poVar7,"] ");
    poVar7 = std::operator<<(poVar7,"too long feature");
    die::operator&(local_65,poVar7);
  }
  if ((local_66 & 1) != 0) {
    die::~die((die *)0x1e3765);
  }
  __dest = scoped_fixed_array<char,_8192>::get(local_40);
  __src = (char *)std::__cxx11::string::c_str();
  sVar4 = scoped_fixed_array<char,_8192>::size(local_40);
  strncpy(__dest,__src,sVar4 - 1);
  scoped_fixed_array<char,_8192>::get(local_40);
  scoped_fixed_array<char_*,_8192>::get(&local_58);
  scoped_fixed_array<char_*,_8192>::size(&local_58);
  pRVar5 = (RewriteRules *)
           tokenizeCSV<char**>(in_stack_fffffffffffffea0,
                               (char **)CONCAT17(in_stack_fffffffffffffe9f,
                                                 CONCAT16(in_stack_fffffffffffffe9e,
                                                          in_stack_fffffffffffffe98)),
                               in_stack_fffffffffffffe90);
  local_70 = pRVar5;
  pRVar6 = (RewriteRules *)scoped_fixed_array<char_*,_8192>::size(&local_58);
  if (pRVar6 <= pRVar5) {
    die::die(&local_71);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xab);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"n < col.size()");
    poVar7 = std::operator<<(poVar7,"] ");
    poVar7 = std::operator<<(poVar7,"too long CSV entities");
    die::operator&(&local_71,poVar7);
    die::~die((die *)0x1e398d);
  }
  scoped_fixed_array<char_*,_8192>::get(&local_58);
  bVar1 = RewriteRules::rewrite
                    (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                     (char **)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                     in_stack_fffffffffffffe70);
  bVar8 = false;
  if (bVar1) {
    sVar4 = in_RDI + 0x18;
    pRVar5 = local_70;
    scoped_fixed_array<char_*,_8192>::get(&local_58);
    uVar2 = RewriteRules::rewrite
                      (pRVar5,sVar4,
                       (char **)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                       in_stack_fffffffffffffe70);
    bVar8 = false;
    if ((bool)uVar2) {
      in_stack_fffffffffffffe60 = (scoped_fixed_array<char_*,_8192> *)(in_RDI + 0x30);
      output = (string *)scoped_fixed_array<char_*,_8192>::get(&local_58);
      bVar8 = RewriteRules::rewrite
                        (pRVar5,sVar4,(char **)CONCAT17(uVar2,in_stack_fffffffffffffe78),output);
    }
  }
  scoped_fixed_array<char_*,_8192>::~scoped_fixed_array(in_stack_fffffffffffffe60);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffffe60);
  return bVar8;
}

Assistant:

bool DictionaryRewriter::rewrite(const std::string &feature,
                                 std::string *ufeature,
                                 std::string *lfeature,
                                 std::string *rfeature) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, BUF_SIZE> col;
  CHECK_DIE(feature.size() < buf.size() - 1) << "too long feature";
  std::strncpy(buf.get(), feature.c_str(), buf.size() - 1);
  const size_t n = tokenizeCSV(buf.get(), col.get(), col.size());
  CHECK_DIE(n < col.size()) << "too long CSV entities";
  return (unigram_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                   ufeature) &&
          left_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                lfeature) &&
          right_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                 rfeature));
}